

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTcpIpConnection.cxx
# Opt level: O3

void __thiscall cmTcpIpConnection::~cmTcpIpConnection(cmTcpIpConnection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmConnectionBufferStrategy *pcVar2;
  pointer pcVar3;
  
  (this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection =
       (_func_int **)&PTR_WriteData_0068ed48;
  auto_handle_base_<uv_tcp_s>::~auto_handle_base_
            ((auto_handle_base_<uv_tcp_s> *)&this->ClientHandle);
  auto_handle_base_<uv_tcp_s>::~auto_handle_base_
            ((auto_handle_base_<uv_tcp_s> *)&this->ServerHandle);
  (this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection =
       (_func_int **)&PTR_WriteData_0068edc8;
  pcVar2 = (this->super_cmEventBasedConnection).BufferStrategy._M_t.
           super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
           .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl;
  if (pcVar2 != (cmConnectionBufferStrategy *)0x0) {
    (*pcVar2->_vptr_cmConnectionBufferStrategy[1])();
  }
  (this->super_cmEventBasedConnection).BufferStrategy._M_t.
  super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
  .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl =
       (cmConnectionBufferStrategy *)0x0;
  pcVar3 = (this->super_cmEventBasedConnection).RawReadBuffer._M_dataplus._M_p;
  paVar1 = &(this->super_cmEventBasedConnection).RawReadBuffer.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  cmConnection::~cmConnection((cmConnection *)this);
  return;
}

Assistant:

cmTcpIpConnection::~cmTcpIpConnection()
{
}